

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O2

void __thiscall
soplex::LPRowSetBase<double>::add
          (LPRowSetBase<double> *this,DataKey *newkey,double *newlhs,
          SVectorBase<double> *newrowVector,double *newrhs,double *newobj,int *newscaleExp)

{
  pointer pdVar1;
  long lVar2;
  int newdim;
  
  SVSetBase<double>::add(&this->super_SVSetBase<double>,newkey,newrowVector);
  newdim = (this->super_SVSetBase<double>).set.thenum;
  pdVar1 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->left).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3) < newdim)
  {
    VectorBase<double>::reDim(&this->left,newdim,true);
    VectorBase<double>::reDim(&this->right,(this->super_SVSetBase<double>).set.thenum,true);
    VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
    DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
    newdim = (this->super_SVSetBase<double>).set.thenum;
    pdVar1 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lVar2 = (long)newdim;
  pdVar1[lVar2 + -1] = *newlhs;
  (this->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar2 + -1] = *newrhs;
  (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar2 + -1] = *newobj;
  (this->scaleExp).data[lVar2 + -1] = *newscaleExp;
  return;
}

Assistant:

void add(DataKey& newkey, const R& newlhs, const SVectorBase<R>& newrowVector, const R& newrhs,
            const R& newobj = 0, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newrowVector);

      if(num() > left.dim())
      {
         left.reDim(num());
         right.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      left[num() - 1] = newlhs;
      right[num() - 1] = newrhs;
      object[num() - 1] = newobj;
      scaleExp[num() - 1] = newscaleExp;
   }